

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt24 u)

{
  StrWriter *this_local;
  UInt24 u_local;
  
  if ((this->style->numberFormat).radix == '\x10') {
    sprintx(&this->ptr,(ulong)u.raw,&this->style->numberFormat,6);
  }
  else {
    sprintd(&this->ptr,(ulong)u.raw,8);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt24 u)
{
    if (style.numberFormat.radix == 16) {
        sprintx(ptr, u.raw, style.numberFormat, 6);
    } else {
        sprintd(ptr, u.raw, 8);
    }
    return *this;
}